

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O2

void free_truecolor_image_data(gdImagePtr oim)

{
  long lVar1;
  
  oim->trueColor = 0;
  for (lVar1 = 0; lVar1 < oim->sy; lVar1 = lVar1 + 1) {
    gdFree(oim->tpixels[lVar1]);
  }
  gdFree(oim->tpixels);
  oim->tpixels = (int **)0x0;
  return;
}

Assistant:

static void free_truecolor_image_data(gdImagePtr oim)
{
	int i;
	oim->trueColor = 0;
	/* Junk the truecolor pixels */
	for (i = 0; i < oim->sy; i++) {
		gdFree (oim->tpixels[i]);
	}
	gdFree (oim->tpixels);
	oim->tpixels = 0;
}